

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

void GUILog(HGUI handle,string *log)

{
  if (*(long *)((long)handle + 0x1a0cb0) != 0) {
    std::__cxx11::string::append((char *)((long)handle + 0x1a0ca8));
  }
  std::__cxx11::string::_M_append((char *)((long)handle + 0x1a0ca8),(ulong)(log->_M_dataplus)._M_p);
  return;
}

Assistant:

void GUILog(HGUI handle, std::string log) {
    GUI* gui = (GUI*)handle;
    if (!gui->Log.empty()) {
        gui->Log += "\n";
    }
    gui->Log += log;
}